

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

void pbrt::BilinearPatch::Init(Allocator alloc)

{
  polymorphic_allocator<std::byte> *in_stack_00000008;
  polymorphic_allocator<std::byte> *in_stack_00000010;
  
  allMeshes = pstd::pmr::polymorphic_allocator<std::byte>::
              new_object<pstd::vector<pbrt::BilinearPatchMesh_const*,pstd::pmr::polymorphic_allocator<pbrt::BilinearPatchMesh_const*>>,pstd::pmr::polymorphic_allocator<std::byte>&>
                        (in_stack_00000010,in_stack_00000008);
  return;
}

Assistant:

void BilinearPatch::Init(Allocator alloc) {
    allMeshes = alloc.new_object<pstd::vector<const BilinearPatchMesh *>>(alloc);
#if defined(PBRT_BUILD_GPU_RENDERER)
    if (Options->useGPU)
        CUDA_CHECK(cudaMemcpyToSymbol((const void *)&allBilinearMeshesGPU,
                                     (const void *)&allMeshes,
                                     sizeof(allMeshes)));
#endif
}